

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  gulps *pgVar1;
  tuple<gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_> tVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  allocator local_101;
  __uniq_ptr_impl<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> local_100;
  __uniq_ptr_impl<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> local_f8;
  string local_f0;
  message local_d0;
  
  pgVar1 = gulps::inst();
  std::__cxx11::string::string((string *)&local_d0,"TEST",(allocator *)&local_f0);
  gulps::set_thread_tag(pgVar1,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  tVar2.super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
  super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       operator_new(0x28);
  (((vector<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_> *)
   ((long)tVar2.
          super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
          super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl + 8))->
  super__Vector_base<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)tVar2.
          super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
          super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)tVar2.
          super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
          super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl + 0x18) = (pointer)0x0;
  *(undefined ***)
   tVar2.super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
   super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl = &PTR__gulps_output_00150a70;
  *(undefined1 *)
   &((gulps_output *)
    ((long)tVar2.
           super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
           super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl + 0x20))->
    _vptr_gulps_output = 1;
  *(undefined4 *)
   ((long)tVar2.
          super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
          super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl + 0x24) = 0xff;
  gulps::gulps_output::add_filter
            ((gulps_output *)
             tVar2.
             super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>
             .super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl,
             main::$_0::__invoke(gulps::message_const__);
  pgVar1 = gulps::inst();
  local_f8._M_t.
  super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
  super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl =
       (tuple<gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       (tuple<gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       tVar2.
       super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
       super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl;
  std::__cxx11::
  list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
  ::push_back(&pgVar1->outputs,(value_type *)&local_f8);
  if ((_Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
      local_f8._M_t.
      super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
      super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl != (gulps_output *)0x0) {
    (**(code **)(*(long *)local_f8._M_t.
                          super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>
                          .super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl + 8))();
  }
  local_f8._M_t.
  super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
  super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl =
       (tuple<gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       (_Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)0x0;
  tVar2.super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
  super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       operator_new(0x2f8);
  std::__cxx11::string::string((string *)&local_d0,"out.txt",(allocator *)&local_f0);
  gulps::gulps_async_file_output::gulps_async_file_output
            ((gulps_async_file_output *)
             tVar2.
             super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>
             .super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  gulps::gulps_output::add_filter
            ((gulps_output *)
             tVar2.
             super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>
             .super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl,
             main::$_1::__invoke(gulps::message_const__);
  pgVar1 = gulps::inst();
  local_100._M_t.
  super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
  super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl =
       (tuple<gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       (tuple<gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       tVar2.
       super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
       super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl;
  std::__cxx11::
  list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
  ::push_back(&pgVar1->outputs,(value_type *)&local_100);
  if ((_Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
      local_100._M_t.
      super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
      super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl != (gulps_output *)0x0) {
    (**(code **)(*(long *)local_100._M_t.
                          super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>
                          .super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl + 8))();
  }
  local_100._M_t.
  super__Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>.
  super__Head_base<0UL,_gulps::gulps_output_*,_false>._M_head_impl =
       (tuple<gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)
       (_Tuple_impl<0UL,_gulps::gulps_output_*,_std::default_delete<gulps::gulps_output>_>)0x0;
  pgVar1 = gulps::inst();
  std::__cxx11::string::string((string *)&local_f0,"test-out",&local_101);
  gulps::message::message
            (&local_d0,LEVEL_OUTPUT_0,"ab","abc",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/main.cpp",
             0x189,&local_f0,red);
  gulps::log(pgVar1,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  gulps::message::~message(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  return 0;
}

Assistant:

int main(int argc, char **argv) 
{
	gulps::inst().set_thread_tag("TEST");
	std::unique_ptr<gulps::gulps_output> out(new gulps::gulps_print_output(true, fmt::color::blue));
	out->add_filter([](const gulps::message& msg) -> bool { return true; });
	gulps::inst().add_output(std::move(out));

	std::unique_ptr<gulps::gulps_output> out2(new gulps::gulps_async_file_output("out.txt"));
	out2->add_filter([](const gulps::message& msg) -> bool { return true; });
	gulps::inst().add_output(std::move(out2));
	
	gulps::inst().log(gulps::message(gulps::LEVEL_OUTPUT_0, "ab", "abc", __FILE__, __LINE__, "test-out", fmt::color::red));
}